

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode multi_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  int iVar1;
  CURLcode CVar2;
  undefined1 local_34 [4];
  int rc;
  multi_done_ctx mdctx;
  connectdata *conn;
  CURLcode r2;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  _rc = data->conn;
  memset(local_34,0,4);
  if ((*(uint *)&(data->state).field_0x774 >> 10 & 1) == 0) {
    Curl_resolver_kill(data);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if (((status == CURLE_WRITE_ERROR) || (status == CURLE_READ_ERROR)) ||
       (r2._3_1_ = premature, status == CURLE_ABORTED_BY_CALLBACK)) {
      r2._3_1_ = 1;
    }
    conn._4_4_ = status;
    if (_rc->handler->done != (_func_CURLcode_Curl_easy_ptr_CURLcode__Bool *)0x0) {
      conn._4_4_ = (*_rc->handler->done)(data,status,(_Bool)(r2._3_1_ & 1));
    }
    if (((conn._4_4_ != CURLE_ABORTED_BY_CALLBACK) &&
        (iVar1 = Curl_pgrsDone(data), conn._4_4_ == CURLE_OK)) && (iVar1 != 0)) {
      conn._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
    CVar2 = Curl_xfer_write_done(data,(_Bool)(r2._3_1_ & 1));
    if ((CVar2 != CURLE_OK) && (conn._4_4_ == CURLE_OK)) {
      conn._4_4_ = CVar2;
    }
    Curl_conn_ev_data_done(data,(_Bool)(r2._3_1_ & 1));
    process_pending_handles(data->multi);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_req_done(&data->req,data,(_Bool)(r2._3_1_ & 1));
    }
    local_34[0] = local_34[0] & 0xfe | r2._3_1_ & 1;
    Curl_cpool_do_locked(data,data->conn,multi_done_locked,local_34);
    Curl_netrc_cleanup(&(data->state).netrc);
    data_local._4_4_ = conn._4_4_;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode multi_done(struct Curl_easy *data,
                           CURLcode status,  /* an error if this is called
                                                after an error was detected */
                           bool premature)
{
  CURLcode result, r2;
  struct connectdata *conn = data->conn;
  struct multi_done_ctx mdctx;

  memset(&mdctx, 0, sizeof(mdctx));

#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
  DEBUGF(infof(data, "multi_done[%s]: status: %d prem: %d done: %d",
               multi_statename[data->mstate],
               (int)status, (int)premature, data->state.done));
#else
  DEBUGF(infof(data, "multi_done: status: %d prem: %d done: %d",
               (int)status, (int)premature, data->state.done));
#endif

  if(data->state.done)
    /* Stop if multi_done() has already been called */
    return CURLE_OK;

  /* Stop the resolver and free its own resources (but not dns_entry yet). */
  Curl_resolver_kill(data);

  /* Cleanup possible redirect junk */
  Curl_safefree(data->req.newurl);
  Curl_safefree(data->req.location);

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we are aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we do not. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
    FALLTHROUGH();
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(data, status, premature);
  else
    result = status;

  if(CURLE_ABORTED_BY_CALLBACK != result) {
    /* avoid this if we already aborted by callback to avoid this calling
       another callback */
    int rc = Curl_pgrsDone(data);
    if(!result && rc)
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  /* Make sure that transfer client writes are really done now. */
  r2 = Curl_xfer_write_done(data, premature);
  if(r2 && !result)
    result = r2;

  /* Inform connection filters that this transfer is done */
  Curl_conn_ev_data_done(data, premature);

  process_pending_handles(data->multi); /* connection / multiplex */

  if(!result)
    result = Curl_req_done(&data->req, data, premature);

  /* Under the potential connection pool's share lock, decide what to
   * do with the transfer's connection. */
  mdctx.premature = premature;
  Curl_cpool_do_locked(data, data->conn, multi_done_locked, &mdctx);

  /* flush the netrc cache */
  Curl_netrc_cleanup(&data->state.netrc);
  return result;
}